

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenFltNum(Lexer *this,size_t num)

{
  size_t sVar1;
  int iVar2;
  NumberToken *this_00;
  ulong in_RDX;
  undefined1 auVar3 [16];
  float f32;
  Error<pfederc::LexerErrorCode> *local_68;
  float local_5c;
  double local_58;
  Position local_50;
  double local_38;
  double dStack_30;
  
  nextChar((Lexer *)num);
  if (9 < *(int *)(num + 0xb0) - 0x30U) {
    getCurrentCursor(&local_50,(Lexer *)num);
    sVar1 = *(size_t *)(num + 0xa8);
    local_68 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
    local_68->logLevel = LVL_ERROR;
    local_68->err = LEX_ERR_NUM_UNEXPECTED_CHAR;
    (local_68->pos).line = local_50.line;
    (local_68->pos).startIndex = sVar1;
    (local_68->pos).endIndex = sVar1;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    if (local_68 == (Error<pfederc::LexerErrorCode> *)0x0) {
      return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
             (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
    }
    std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_68,local_68);
    return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
  }
  auVar3._8_4_ = (int)(in_RDX >> 0x20);
  auVar3._0_8_ = in_RDX;
  auVar3._12_4_ = 0x45300000;
  dStack_30 = auVar3._8_8_ - 1.9342813113834067e+25;
  f32 = (float)in_RDX;
  local_38 = dStack_30 + ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0);
  local_58 = 10.0;
  local_5c = 10.0;
  do {
    iVar2 = *(int *)(num + 0xb0) + -0x30;
    f32 = f32 + (float)iVar2 / local_5c;
    local_38 = local_38 + (double)iVar2 / local_58;
    local_5c = local_5c * 10.0;
    local_58 = local_58 * 10.0;
    iVar2 = nextChar((Lexer *)num);
  } while (iVar2 - 0x30U < 10);
  if (*(int *)(num + 0xb0) == 0x46) {
    nextChar((Lexer *)num);
  }
  else if (*(int *)(num + 0xb0) == 0x66) {
    nextChar((Lexer *)num);
    getCurrentCursor(&local_50,(Lexer *)num);
    this_00 = (NumberToken *)operator_new(0x38);
    NumberToken::NumberToken(this_00,*(Token **)(num + 0xb8),TOK_FLT32,&local_50,f32);
    goto LAB_0010abfe;
  }
  this_00 = (NumberToken *)0x0;
LAB_0010abfe:
  iVar2 = isalnum(*(int *)(num + 0xb0));
  if (iVar2 == 0) {
    if (this_00 == (NumberToken *)0x0) {
      getCurrentCursor(&local_50,(Lexer *)num);
      this_00 = (NumberToken *)operator_new(0x38);
      NumberToken::NumberToken(this_00,*(Token **)(num + 0xb8),TOK_FLT64,&local_50,local_38);
    }
    this->_vptr_Lexer = (_func_int **)this_00;
  }
  else {
    getCurrentCursor(&local_50,(Lexer *)num);
    sVar1 = *(size_t *)(num + 0xa8);
    local_68 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
    local_68->logLevel = LVL_ERROR;
    local_68->err = LEX_ERR_NUM_UNEXPECTED_CHAR;
    (local_68->pos).line = local_50.line;
    (local_68->pos).startIndex = sVar1;
    (local_68->pos).endIndex = sVar1;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    if (local_68 != (Error<pfederc::LexerErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_68,local_68);
    }
    if (this_00 != (NumberToken *)0x0) {
      (*(this_00->super_Token)._vptr_Token[1])(this_00);
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenFltNum(size_t num) noexcept {
  nextChar(); // eat .

  float f32 = static_cast<float>(num);
  double f64 = static_cast<double>(num);
  
  if (!isdigit(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  float po32 = 10.0f;
  double po64 = 10.0;

  do {
    f32 += static_cast<float>(currentChar - '0') / po32;
    f64 += static_cast<double>(currentChar - '0') / po64;
    po32 *= 10.0f;
    po64 *= 10.0;
  } while (isdigit(nextChar()));

  std::unique_ptr<Token> tok(nullptr);
  switch (currentChar) {
  case 'f':
    nextChar(); // eat f
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_FLT32, getCurrentCursor(), f32);
    break;
  case 'F':
    nextChar(); // eat F
    break;
  default:
    break;
  }

  if (isalnum(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  if (tok)
    return tok;

  return std::make_unique<NumberToken>(currentToken, TokenType::TOK_FLT64, getCurrentCursor(), f64);
}